

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenTableBuilders
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  size_type_conflict t;
  reference ppFVar2;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  string local_528;
  string local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  size_t local_488;
  size_t elem_size;
  size_t alignment;
  Type vector_type;
  string local_438;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  FieldDef *local_378;
  FieldDef *field_1;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_368;
  const_iterator it_1;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_120;
  difference_type local_118;
  difference_type offset;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_100;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  LobsterGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  NormalizedName_abi_cxx11_(&local_88,this,&struct_def->super_Definition);
  std::operator+(&local_68,"struct ",&local_88);
  std::operator+(&local_48,&local_68,"Builder:\n    b_:flatbuffers.builder\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  t = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                 ((long)&code_ptr_local[7].field_2 + 8));
  NumToString<unsigned_long>((string *)&it,t);
  std::operator+(&local_d8,"    def start():\n        b_.StartObject(",(string *)&it);
  std::operator+(&local_b8,&local_d8,")\n        return this\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&it);
  local_100._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       ((long)&code_ptr_local[7].field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_100,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_100);
    offset = (difference_type)*ppFVar2;
    if ((((FieldDef *)offset)->deprecated & 1U) == 0) {
      local_120._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      ((long)&code_ptr_local[7].field_2 + 8));
      local_118 = __gnu_cxx::operator-(&local_100,&local_120);
      NormalizedName_abi_cxx11_(&local_2a0,this,(Definition *)offset);
      std::operator+(&local_280,"    def add_",&local_2a0);
      std::operator+(&local_260,&local_280,"(");
      NormalizedName_abi_cxx11_(&local_2c0,this,(Definition *)offset);
      std::operator+(&local_240,&local_260,&local_2c0);
      std::operator+(&local_220,&local_240,":");
      LobsterType_abi_cxx11_(&local_2e0,this,(Type *)(offset + 200));
      std::operator+(&local_200,&local_220,&local_2e0);
      std::operator+(&local_1e0,&local_200,"):\n        b_.Prepend");
      GenMethod_abi_cxx11_(&local_300,this,(Type *)(offset + 200));
      std::operator+(&local_1c0,&local_1e0,&local_300);
      std::operator+(&local_1a0,&local_1c0,"Slot(");
      NumToString<long>(&local_320,local_118);
      std::operator+(&local_180,&local_1a0,&local_320);
      std::operator+(&local_160,&local_180,", ");
      NormalizedName_abi_cxx11_(&local_340,this,(Definition *)offset);
      std::operator+(&local_140,&local_160,&local_340);
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      bVar1 = IsScalar(*(BaseType *)(offset + 200));
      if ((bVar1) && (bVar1 = FieldDef::IsOptional((FieldDef *)offset), !bVar1)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                       ", ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (offset + 0xe8));
        std::__cxx11::string::operator+=((string *)local_28,(string *)&it_1);
        std::__cxx11::string::~string((string *)&it_1);
      }
      std::__cxx11::string::operator+=((string *)local_28,")\n        return this\n");
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_100);
  }
  std::__cxx11::string::operator+=
            ((string *)local_28,"    def end():\n        return b_.EndObject()\n\n");
  local_368._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field_1 = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)((long)&code_ptr_local[7].field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_368,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field_1);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_368);
    local_378 = *ppFVar2;
    if (((local_378->deprecated & 1U) == 0) && (bVar1 = IsVector(&(local_378->value).type), bVar1))
    {
      NormalizedName_abi_cxx11_(&local_418,this,(Definition *)code_ptr_local);
      std::operator+(&local_3f8,"def ",&local_418);
      std::operator+(&local_3d8,&local_3f8,"Start");
      NormalizedName_abi_cxx11_
                ((string *)&vector_type.fixed_length,this,&local_378->super_Definition);
      ConvertCase(&local_438,(string *)&vector_type.fixed_length,kUpperCamel,kSnake);
      std::operator+(&local_3b8,&local_3d8,&local_438);
      std::operator+(&local_398,&local_3b8,
                     "Vector(b_:flatbuffers.builder, n_:int):\n    b_.StartVector(");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&vector_type.fixed_length);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      Type::VectorType((Type *)&alignment,&(local_378->value).type);
      elem_size = InlineAlignment((Type *)&alignment);
      local_488 = InlineSize((Type *)&alignment);
      NumToString<unsigned_long>(&local_508,local_488);
      std::operator+(&local_4e8,&local_508,", n_, ");
      NumToString<unsigned_long>(&local_528,elem_size);
      std::operator+(&local_4c8,&local_4e8,&local_528);
      std::operator+(&local_4a8,&local_4c8,")\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      if (((int)alignment != 0xf) || ((*(byte *)(vector_type._0_8_ + 0x110) & 1) == 0)) {
        NormalizedName_abi_cxx11_(&local_6c8,this,(Definition *)code_ptr_local);
        std::operator+(&local_6a8,"def ",&local_6c8);
        std::operator+(&local_688,&local_6a8,"Create");
        NormalizedName_abi_cxx11_(&local_708,this,&local_378->super_Definition);
        ConvertCase(&local_6e8,&local_708,kUpperCamel,kSnake);
        std::operator+(&local_668,&local_688,&local_6e8);
        std::operator+(&local_648,&local_668,"Vector(b_:flatbuffers.builder, v_:[");
        LobsterType_abi_cxx11_(&local_728,this,(Type *)&alignment);
        std::operator+(&local_628,&local_648,&local_728);
        std::operator+(&local_608,&local_628,"]):\n    b_.StartVector(");
        NumToString<unsigned_long>(&local_748,local_488);
        std::operator+(&local_5e8,&local_608,&local_748);
        std::operator+(&local_5c8,&local_5e8,", v_.length, ");
        NumToString<unsigned_long>(&local_768,elem_size);
        std::operator+(&local_5a8,&local_5c8,&local_768);
        std::operator+(&local_588,&local_5a8,")\n    reverse(v_) e_: b_.Prepend");
        GenMethod_abi_cxx11_(&local_788,this,(Type *)&alignment);
        std::operator+(&local_568,&local_588,&local_788);
        std::operator+(&local_548,&local_568,"(e_)\n    return b_.EndVector(v_.length)\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_548);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
        std::__cxx11::string::~string((string *)&local_788);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::__cxx11::string::~string((string *)&local_768);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::__cxx11::string::~string((string *)&local_748);
        std::__cxx11::string::~string((string *)&local_608);
        std::__cxx11::string::~string((string *)&local_628);
        std::__cxx11::string::~string((string *)&local_728);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::~string((string *)&local_668);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::__cxx11::string::~string((string *)&local_708);
        std::__cxx11::string::~string((string *)&local_688);
        std::__cxx11::string::~string((string *)&local_6a8);
        std::__cxx11::string::~string((string *)&local_6c8);
      }
      std::__cxx11::string::operator+=((string *)local_28,"\n");
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_368);
  }
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "struct " + NormalizedName(struct_def) +
            "Builder:\n    b_:flatbuffers.builder\n";
    code += "    def start():\n        b_.StartObject(" +
            NumToString(struct_def.fields.vec.size()) +
            ")\n        return this\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto offset = it - struct_def.fields.vec.begin();
      code += "    def add_" + NormalizedName(field) + "(" +
              NormalizedName(field) + ":" + LobsterType(field.value.type) +
              "):\n        b_.Prepend" + GenMethod(field.value.type) + "Slot(" +
              NumToString(offset) + ", " + NormalizedName(field);
      if (IsScalar(field.value.type.base_type) && !field.IsOptional())
        code += ", " + field.value.constant;
      code += ")\n        return this\n";
    }
    code += "    def end():\n        return b_.EndObject()\n\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsVector(field.value.type)) {
        code += "def " + NormalizedName(struct_def) + "Start" +
                ConvertCase(NormalizedName(field), Case::kUpperCamel) +
                "Vector(b_:flatbuffers.builder, n_:int):\n    b_.StartVector(";
        auto vector_type = field.value.type.VectorType();
        auto alignment = InlineAlignment(vector_type);
        auto elem_size = InlineSize(vector_type);
        code +=
            NumToString(elem_size) + ", n_, " + NumToString(alignment) + ")\n";
        if (vector_type.base_type != BASE_TYPE_STRUCT ||
            !vector_type.struct_def->fixed) {
          code += "def " + NormalizedName(struct_def) + "Create" +
                  ConvertCase(NormalizedName(field), Case::kUpperCamel) +
                  "Vector(b_:flatbuffers.builder, v_:[" +
                  LobsterType(vector_type) + "]):\n    b_.StartVector(" +
                  NumToString(elem_size) + ", v_.length, " +
                  NumToString(alignment) + ")\n    reverse(v_) e_: b_.Prepend" +
                  GenMethod(vector_type) +
                  "(e_)\n    return b_.EndVector(v_.length)\n";
        }
        code += "\n";
      }
    }
  }